

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.h
# Opt level: O1

QSize operator*(QSize *s,qreal c)

{
  ulong uVar1;
  undefined4 in_EDX;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  double dVar6;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  
  dVar4 = c * (double)(*s).wd.m_i;
  dVar6 = c * (double)(*s).ht.m_i;
  auVar5._0_8_ = (double)((ulong)dVar4 & 0x8000000000000000 | 0x3fe0000000000000) + dVar4;
  auVar5._8_8_ = (double)((ulong)dVar6 & 0x8000000000000000 | 0x3fe0000000000000) + dVar6;
  auVar5 = minpd(_DAT_0066f5d0,auVar5);
  auVar7._8_8_ = -(ulong)(-2147483648.0 < auVar5._8_8_);
  auVar7._0_8_ = -(ulong)(-2147483648.0 < auVar5._0_8_);
  uVar2 = movmskpd(in_EDX,auVar7);
  uVar3 = 0x8000000000000000;
  if ((uVar2 & 2) != 0) {
    uVar3 = (ulong)(uint)(int)auVar5._8_8_ << 0x20;
  }
  uVar1 = 0x80000000;
  if ((uVar2 & 1) != 0) {
    uVar1 = (ulong)(uint)(int)auVar5._0_8_;
  }
  return (QSize)(uVar1 | uVar3);
}

Assistant:

friend inline constexpr QSize operator*(const QSize &s, qreal c) noexcept
    { return QSize(QtPrivate::qSaturateRound(s.width() * c), QtPrivate::qSaturateRound(s.height() * c)); }